

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_io.cpp
# Opt level: O0

endpoint *
libtorrent::aux::parse_endpoint(endpoint *__return_storage_ptr__,string_view str,error_code *ec)

{
  bool bVar1;
  unsigned_short uVar2;
  int iVar3;
  const_reference pvVar4;
  char *pcVar5;
  char *extraout_RDX;
  error_code *in_R8;
  string_view sVar6;
  string_view str_00;
  string_view str_01;
  allocator<char> local_171;
  string local_170 [36];
  int local_14c;
  char *pcStack_148;
  int port_num;
  error_code *local_140;
  address_v4 local_134;
  address local_130;
  basic_string_view<char,_std::char_traits<char>_> local_110;
  basic_string_view<char,_std::char_traits<char>_> local_100;
  size_type local_f0;
  size_type port_pos;
  char *local_e0;
  address_v6 local_d8;
  address local_c0;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  size_type local_70;
  size_type close_bracket;
  string_view port;
  string_view addr;
  error_code *local_38;
  char *local_30;
  error_code *ec_local;
  string_view str_local;
  endpoint *ret;
  
  str_local._M_len = (size_t)str._M_str;
  ec_local = (error_code *)str._M_len;
  str_local._M_str = (char *)__return_storage_ptr__;
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint(__return_storage_ptr__);
  sVar6._M_str = extraout_RDX;
  sVar6._M_len = str_local._M_len;
  sVar6 = trim((libtorrent *)ec_local,sVar6);
  local_38 = (error_code *)sVar6._M_len;
  ec_local = local_38;
  local_30 = sVar6._M_str;
  str_local._M_len = (size_t)local_30;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&port._M_str);
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&close_bracket);
  bVar1 = ::std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&ec_local);
  if (bVar1) {
    boost::system::error_code::operator=(ec,invalid_port);
    return __return_storage_ptr__;
  }
  pvVar4 = ::std::basic_string_view<char,_std::char_traits<char>_>::front
                     ((basic_string_view<char,_std::char_traits<char>_> *)&ec_local);
  if (*pvVar4 == '[') {
    local_70 = ::std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                         ((basic_string_view<char,_std::char_traits<char>_> *)&ec_local,']',0);
    if (local_70 == 0xffffffffffffffff) {
      boost::system::error_code::operator=(ec,expected_close_bracket_in_address);
      return __return_storage_ptr__;
    }
    local_80 = ::std::basic_string_view<char,_std::char_traits<char>_>::substr
                         ((basic_string_view<char,_std::char_traits<char>_> *)&ec_local,1,
                          local_70 - 1);
    port._M_str = (char *)local_80._M_len;
    pcVar5 = local_80._M_str;
    local_90 = ::std::basic_string_view<char,_std::char_traits<char>_>::substr
                         ((basic_string_view<char,_std::char_traits<char>_> *)&ec_local,local_70 + 1
                          ,0xffffffffffffffff);
    close_bracket = local_90._M_len;
    port._M_len = (size_t)local_90._M_str;
    bVar1 = ::std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&close_bracket);
    if ((bVar1) ||
       (pvVar4 = ::std::basic_string_view<char,_std::char_traits<char>_>::front
                           ((basic_string_view<char,_std::char_traits<char>_> *)&close_bracket),
       *pvVar4 != ':')) {
      boost::system::error_code::operator=(ec,invalid_port);
      return __return_storage_ptr__;
    }
    local_a0 = ::std::basic_string_view<char,_std::char_traits<char>_>::substr
                         ((basic_string_view<char,_std::char_traits<char>_> *)&close_bracket,1,
                          0xffffffffffffffff);
    close_bracket = local_a0._M_len;
    port._M_len = (size_t)local_a0._M_str;
    port_pos = (size_type)port._M_str;
    local_e0 = pcVar5;
    str_00._M_str = (char *)ec;
    str_00._M_len = (size_t)pcVar5;
    boost::asio::ip::make_address_v6(&local_d8,(ip *)port._M_str,str_00,in_R8);
    boost::asio::ip::address::address(&local_c0,&local_d8);
    boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address(__return_storage_ptr__,&local_c0)
    ;
    bVar1 = boost::system::error_code::operator_cast_to_bool(ec);
    if (bVar1) {
      return __return_storage_ptr__;
    }
  }
  else {
    local_f0 = ::std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                         ((basic_string_view<char,_std::char_traits<char>_> *)&ec_local,':',0);
    if (local_f0 == 0xffffffffffffffff) {
      boost::system::error_code::operator=(ec,invalid_port);
      return __return_storage_ptr__;
    }
    local_100 = ::std::basic_string_view<char,_std::char_traits<char>_>::substr
                          ((basic_string_view<char,_std::char_traits<char>_> *)&ec_local,0,local_f0)
    ;
    port._M_str = (char *)local_100._M_len;
    pcVar5 = local_100._M_str;
    local_110 = ::std::basic_string_view<char,_std::char_traits<char>_>::substr
                          ((basic_string_view<char,_std::char_traits<char>_> *)&ec_local,
                           local_f0 + 1,0xffffffffffffffff);
    close_bracket = local_110._M_len;
    port._M_len = (size_t)local_110._M_str;
    pcStack_148 = port._M_str;
    local_140 = (error_code *)pcVar5;
    str_01._M_str = port._M_str;
    str_01._M_len = (size_t)&local_134;
    boost::asio::ip::make_address_v4(str_01,(error_code *)pcVar5);
    boost::asio::ip::address::address(&local_130,&local_134);
    boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
              (__return_storage_ptr__,&local_130);
    bVar1 = boost::system::error_code::operator_cast_to_bool(ec);
    if (bVar1) {
      return __return_storage_ptr__;
    }
  }
  bVar1 = ::std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&close_bracket);
  if (bVar1) {
    boost::system::error_code::operator=(ec,invalid_port);
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (local_170,(basic_string_view<char,_std::char_traits<char>_> *)&close_bracket,
               &local_171);
    pcVar5 = (char *)::std::__cxx11::string::c_str();
    iVar3 = atoi(pcVar5);
    ::std::__cxx11::string::~string(local_170);
    ::std::allocator<char>::~allocator(&local_171);
    local_14c = iVar3;
    if ((iVar3 < 1) ||
       (uVar2 = ::std::numeric_limits<unsigned_short>::max(), (int)(uint)uVar2 < iVar3)) {
      boost::system::error_code::operator=(ec,invalid_port);
    }
    else {
      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::port
                (__return_storage_ptr__,(unsigned_short)local_14c);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

tcp::endpoint parse_endpoint(string_view str, error_code& ec)
	{
		tcp::endpoint ret;

		str = trim(str);

		string_view addr;
		string_view port;

		if (str.empty())
		{
			ec = errors::invalid_port;
			return ret;
		}

		// this is for IPv6 addresses
		if (str.front() == '[')
		{
			auto const close_bracket = str.find_first_of(']');
			if (close_bracket == string_view::npos)
			{
				ec = errors::expected_close_bracket_in_address;
				return ret;
			}
			addr = str.substr(1, close_bracket - 1);
			port = str.substr(close_bracket + 1);
			if (port.empty() || port.front() != ':')
			{
				ec = errors::invalid_port;
				return ret;
			}
			// shave off the ':'
			port = port.substr(1);
			ret.address(make_address_v6(addr, ec));
			if (ec) return ret;
		}
		else
		{
			auto const port_pos = str.find_first_of(':');
			if (port_pos == string_view::npos)
			{
				ec = errors::invalid_port;
				return ret;
			}
			addr = str.substr(0, port_pos);
			port = str.substr(port_pos + 1);
			ret.address(make_address_v4(addr, ec));
			if (ec) return ret;
		}

		if (port.empty())
		{
			ec = errors::invalid_port;
			return ret;
		}

		int const port_num = std::atoi(std::string(port).c_str());
		if (port_num <= 0 || port_num > std::numeric_limits<std::uint16_t>::max())
		{
			ec = errors::invalid_port;
			return ret;
		}
		ret.port(static_cast<std::uint16_t>(port_num));
		return ret;
	}